

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestLong_Test::TestBody
          (PriceFieldTest_TestLong_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  PriceField field;
  int64_t value;
  AssertHelper local_60;
  Message local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  PriceField local_40 [16];
  long local_30;
  long *local_28;
  long local_18 [2];
  
  local_30 = 0x85e0b0cba7;
  bidfx_public_api::price::PriceField::PriceField(local_40,0x85e0b0cba7);
  local_60.data_._0_4_ = 1;
  local_48.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&local_58,"PriceField::LONG","field.GetType()",(Type *)&local_60,
             (Type *)&local_48);
  if (local_58.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.data_ = (AssertHelperData *)bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_58,"value","field.GetLong()",&local_30,(long *)&local_60);
  if (local_58.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetInt();
  }
  testing::Message::Message(&local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x28,
             "Expected: field.GetInt() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetDouble();
  }
  testing::Message::Message(&local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x29,
             "Expected: field.GetDouble() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
    if (local_28 != local_18) {
      operator_delete(local_28,local_18[0] + 1);
    }
  }
  testing::Message::Message(&local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x2a,
             "Expected: field.GetString() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) + 8))();
    }
  }
  bidfx_public_api::price::PriceField::~PriceField(local_40);
  return;
}

Assistant:

TEST(PriceFieldTest, TestLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    EXPECT_EQ(PriceField::LONG, field.GetType());
    EXPECT_EQ(value, field.GetLong());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
    EXPECT_THROW(field.GetString(), std::logic_error);
}